

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O2

void dr_prediction_z1_64xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar12 [16];
  ushort uVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar24 [16];
  short sVar25;
  short sVar26;
  ushort uVar27;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 in_XMM8 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ushort uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 in_XMM10 [16];
  undefined1 auVar40 [16];
  
  lVar1 = (long)N + 0x3f;
  auVar22 = pshufb(ZEXT116(above[(long)N + 0x3f]),(undefined1  [16])0x0);
  uVar6 = (uint)lVar1;
  auVar23 = pshufb(ZEXT416(uVar6),(undefined1  [16])0x0);
  iVar7 = 0;
  iVar3 = N;
  if (N < 1) {
    iVar3 = 0;
  }
  auVar24 = pmovsxbw(in_XMM4,0x1010101010101010);
  uVar8 = upsample_above;
  while( true ) {
    if (iVar7 == iVar3) {
      return;
    }
    iVar4 = (int)uVar8 >> 6;
    iVar2 = N;
    if (iVar4 < (int)uVar6) {
      auVar12 = ZEXT416(uVar8 >> 1 & 0x1f);
      auVar12 = pshuflw(auVar12,auVar12,0);
      lVar10 = (long)iVar4;
      for (uVar9 = 0; uVar9 < 0x40; uVar9 = uVar9 + 0x10) {
        auVar14 = auVar22;
        if ((long)(lVar10 + uVar9) < lVar1) {
          auVar14 = *(undefined1 (*) [16])(above + uVar9 + lVar10);
          auVar13 = *(undefined1 (*) [16])(above + uVar9 + lVar10 + 1);
          auVar28 = pmovzxbw(in_XMM8,auVar14);
          auVar40 = pmovzxbw(in_XMM10,auVar13);
          auVar29 = psllw(auVar28,5);
          sVar25 = auVar12._0_2_;
          sVar26 = auVar12._2_2_;
          uVar27 = (ushort)(auVar29._0_2_ + auVar24._0_2_ + (auVar40._0_2_ - auVar28._0_2_) * sVar25
                           ) >> 5;
          uVar30 = (ushort)(auVar29._2_2_ + auVar24._2_2_ + (auVar40._2_2_ - auVar28._2_2_) * sVar26
                           ) >> 5;
          uVar31 = (ushort)(auVar29._4_2_ + auVar24._4_2_ + (auVar40._4_2_ - auVar28._4_2_) * sVar25
                           ) >> 5;
          uVar32 = (ushort)(auVar29._6_2_ + auVar24._6_2_ + (auVar40._6_2_ - auVar28._6_2_) * sVar26
                           ) >> 5;
          uVar33 = (ushort)(auVar29._8_2_ + auVar24._8_2_ + (auVar40._8_2_ - auVar28._8_2_) * sVar25
                           ) >> 5;
          uVar34 = (ushort)(auVar29._10_2_ + auVar24._10_2_ +
                           (auVar40._10_2_ - auVar28._10_2_) * sVar26) >> 5;
          uVar35 = (ushort)(auVar29._12_2_ + auVar24._12_2_ +
                           (auVar40._12_2_ - auVar28._12_2_) * sVar25) >> 5;
          uVar36 = (ushort)(auVar29._14_2_ + auVar24._14_2_ +
                           (auVar40._14_2_ - auVar28._14_2_) * sVar26) >> 5;
          auVar28._0_2_ = CONCAT11(0,auVar14[8]);
          auVar28[2] = auVar14[9];
          auVar28[3] = 0;
          auVar28[4] = auVar14[10];
          auVar28[5] = 0;
          auVar28[6] = auVar14[0xb];
          auVar28[7] = 0;
          auVar28[8] = auVar14[0xc];
          auVar28[9] = 0;
          auVar28[10] = auVar14[0xd];
          auVar28[0xb] = 0;
          auVar28[0xc] = auVar14[0xe];
          auVar28[0xd] = 0;
          auVar28[0xe] = auVar14[0xf];
          auVar28[0xf] = 0;
          auVar29 = psllw(auVar28,5);
          uVar11 = (ushort)(auVar29._0_2_ + auVar24._0_2_ + (auVar13[8] - auVar28._0_2_) * sVar25)
                   >> 5;
          uVar15 = (ushort)(auVar29._2_2_ + auVar24._2_2_ +
                           ((ushort)auVar13[9] - (ushort)auVar14[9]) * sVar26) >> 5;
          uVar16 = (ushort)(auVar29._4_2_ + auVar24._4_2_ +
                           ((ushort)auVar13[10] - (ushort)auVar14[10]) * sVar25) >> 5;
          uVar17 = (ushort)(auVar29._6_2_ + auVar24._6_2_ +
                           ((ushort)auVar13[0xb] - (ushort)auVar14[0xb]) * sVar26) >> 5;
          uVar18 = (ushort)(auVar29._8_2_ + auVar24._8_2_ +
                           ((ushort)auVar13[0xc] - (ushort)auVar14[0xc]) * sVar25) >> 5;
          uVar19 = (ushort)(auVar29._10_2_ + auVar24._10_2_ +
                           ((ushort)auVar13[0xd] - (ushort)auVar14[0xd]) * sVar26) >> 5;
          uVar20 = (ushort)(auVar29._12_2_ + auVar24._12_2_ +
                           ((ushort)auVar13[0xe] - (ushort)auVar14[0xe]) * sVar25) >> 5;
          uVar21 = (ushort)(auVar29._14_2_ + auVar24._14_2_ +
                           ((ushort)auVar13[0xf] - (ushort)auVar14[0xf]) * sVar26) >> 5;
          in_XMM8[1] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
          in_XMM8[0] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
          in_XMM8[2] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
          in_XMM8[3] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
          in_XMM8[4] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
          in_XMM8[5] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
          in_XMM8[6] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
          in_XMM8[7] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
          in_XMM8[8] = (uVar11 != 0) * (uVar11 < 0x100) * (char)uVar11 - (0xff < uVar11);
          in_XMM8[9] = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
          in_XMM8[10] = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16);
          in_XMM8[0xb] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
          in_XMM8[0xc] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
          in_XMM8[0xd] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
          in_XMM8[0xe] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
          in_XMM8[0xf] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
          uVar5 = iVar4 + (int)uVar9;
          uVar39 = (undefined1)(uVar5 >> 0x18);
          uVar38 = (undefined1)(uVar5 >> 0x10);
          uVar37 = (undefined1)(uVar5 >> 8);
          auVar14._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar39,uVar39),uVar38),CONCAT14(uVar38,uVar5)) >>
                    0x20);
          auVar14[3] = uVar37;
          auVar14[2] = uVar37;
          auVar14[0] = (char)uVar5;
          auVar14[1] = auVar14[0];
          auVar14._8_8_ = 0;
          auVar13 = pshuflw(auVar14,auVar14,0);
          in_XMM10._0_4_ =
               CONCAT13(auVar13[3] + '\a',
                        CONCAT12(auVar13[2] + '\x06',
                                 CONCAT11(auVar13[1] + '\x05',auVar13[0] + '\x04')));
          in_XMM10[4] = auVar13[4];
          in_XMM10[5] = auVar13[5];
          in_XMM10[6] = auVar13[6];
          in_XMM10[7] = auVar13[7];
          in_XMM10[8] = auVar13[8];
          in_XMM10[9] = auVar13[9];
          in_XMM10[10] = auVar13[10];
          in_XMM10[0xb] = auVar13[0xb];
          in_XMM10[0xc] = auVar13[0xc];
          in_XMM10[0xd] = auVar13[0xd];
          in_XMM10[0xe] = auVar13[0xe];
          in_XMM10[0xf] = auVar13[0xf];
          auVar29[9] = auVar13[1] + '\t';
          auVar29[8] = auVar13[0] + '\b';
          auVar29[10] = auVar13[2] + '\n';
          auVar29[0xb] = auVar13[3] + '\v';
          auVar29[0xc] = in_XMM10[4] + '\f';
          auVar29[0xd] = in_XMM10[5] + '\r';
          auVar29[0xe] = in_XMM10[6] + '\x0e';
          auVar29[0xf] = in_XMM10[7] + '\x0f';
          auVar29._4_4_ = in_XMM10._0_4_;
          auVar29._0_4_ =
               uVar5 & 0xff | (uint)(byte)(auVar14[0] + 1) << 8 |
               (uint)(byte)(auVar14[0] + 2) << 0x10 | (uint)(byte)(auVar14[0] + 3) << 0x18;
          auVar14 = psubusb(auVar23,auVar29);
          auVar13[0] = -('\0' < auVar14[0]);
          auVar13[1] = -('\0' < auVar14[1]);
          auVar13[2] = -('\0' < auVar14[2]);
          auVar13[3] = -('\0' < auVar14[3]);
          auVar13[4] = -('\0' < auVar14[4]);
          auVar13[5] = -('\0' < auVar14[5]);
          auVar13[6] = -('\0' < auVar14[6]);
          auVar13[7] = -('\0' < auVar14[7]);
          auVar13[8] = -('\0' < auVar14[8]);
          auVar13[9] = -('\0' < auVar14[9]);
          auVar13[10] = -('\0' < auVar14[10]);
          auVar13[0xb] = -('\0' < auVar14[0xb]);
          auVar13[0xc] = -('\0' < auVar14[0xc]);
          auVar13[0xd] = -('\0' < auVar14[0xd]);
          auVar13[0xe] = -('\0' < auVar14[0xe]);
          auVar13[0xf] = -('\0' < auVar14[0xf]);
          auVar14 = pblendvb(auVar22,in_XMM8,auVar13);
        }
        *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + uVar9) = auVar14;
      }
      uVar8 = uVar8 + upsample_above;
    }
    else {
      while (iVar2 != 0) {
        *(undefined1 (*) [16])dst = auVar22;
        *(undefined1 (*) [16])((long)dst + 0x10) = auVar22;
        *(undefined1 (*) [16])((long)dst + 0x20) = auVar22;
        *(undefined1 (*) [16])((long)dst + 0x30) = auVar22;
        dst = *(undefined1 (*) [16])dst + stride;
        iVar2 = iVar2 + -1;
      }
    }
    if ((int)uVar6 <= iVar4) break;
    iVar7 = iVar7 + 1;
    dst = *(undefined1 (*) [16])dst + stride;
    N = N + -1;
  }
  return;
}

Assistant:

static void dr_prediction_z1_64xN_sse4_1(int N, uint8_t *dst, ptrdiff_t stride,
                                         const uint8_t *above,
                                         int upsample_above, int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m128i a0, a1, a32, a16;
  __m128i a_mbase_x, diff, c3f;
  __m128i max_base, base_inc, mask;

  a16 = _mm_set1_epi16(16);
  a_mbase_x = _mm_set1_epi8((char)above[max_base_x]);
  max_base = _mm_set1_epi8(max_base_x);
  c3f = _mm_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m128i b, res, res1;
    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm_storeu_si128((__m128i *)dst, a_mbase_x);  // save 32 values
        _mm_storeu_si128((__m128i *)(dst + 16), a_mbase_x);
        _mm_storeu_si128((__m128i *)(dst + 32), a_mbase_x);
        _mm_storeu_si128((__m128i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m128i shift =
        _mm_srli_epi16(_mm_and_si128(_mm_set1_epi16(x), c3f), 1);  // 8 element

    __m128i a0_above, a1_above, res_val;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm_storeu_si128((__m128i *)(dst + j), a_mbase_x);
      } else {
        a0_above =
            _mm_loadu_si128((__m128i *)(above + base + j));  // load 16 element
        a1_above = _mm_loadu_si128((__m128i *)(above + base + 1 + j));

        // lower half
        a0 = _mm_cvtepu8_epi16(a0_above);
        a1 = _mm_cvtepu8_epi16(a1_above);

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm_mullo_epi16(diff, shift);

        res = _mm_add_epi16(a32, b);
        res = _mm_srli_epi16(res, 5);

        // uppar half
        a0 = _mm_cvtepu8_epi16(_mm_srli_si128(a0_above, 8));
        a1 = _mm_cvtepu8_epi16(_mm_srli_si128(a1_above, 8));

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16

        b = _mm_mullo_epi16(diff, shift);
        res1 = _mm_add_epi16(a32, b);
        res1 = _mm_srli_epi16(res1, 5);

        res = _mm_packus_epi16(res, res1);  // 16 8bit values

        base_inc =
            _mm_setr_epi8((int8_t)(base + j), (int8_t)(base + j + 1),
                          (int8_t)(base + j + 2), (int8_t)(base + j + 3),
                          (int8_t)(base + j + 4), (int8_t)(base + j + 5),
                          (int8_t)(base + j + 6), (int8_t)(base + j + 7),
                          (int8_t)(base + j + 8), (int8_t)(base + j + 9),
                          (int8_t)(base + j + 10), (int8_t)(base + j + 11),
                          (int8_t)(base + j + 12), (int8_t)(base + j + 13),
                          (int8_t)(base + j + 14), (int8_t)(base + j + 15));

        mask = _mm_cmpgt_epi8(_mm_subs_epu8(max_base, base_inc),
                              _mm_setzero_si128());
        res_val = _mm_blendv_epi8(a_mbase_x, res, mask);
        _mm_storeu_si128((__m128i *)(dst + j), res_val);
      }
    }
    x += dx;
  }
}